

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O0

HRESULT __thiscall Js::Utf8SourceInfo::EnsureLineOffsetCacheNoThrow(Utf8SourceInfo *this)

{
  LineOffsetCache **ppLVar1;
  OutOfMemoryException anon_var_0;
  StackOverflowException anon_var_0_1;
  NotImplementedException anon_var_0_2;
  ScriptAbortException anon_var_0_3;
  AsmJsParseException anon_var_0_4;
  Var errorObject;
  JavascriptExceptionObject *exceptionObject;
  JavascriptException *err;
  AutoNestedHandledExceptionType local_18;
  HRESULT local_14;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  HRESULT hr;
  Utf8SourceInfo *this_local;
  
  local_14 = 0;
  ___autoNestedHandledExceptionType = this;
  ppLVar1 = Memory::WriteBarrierPtr::operator_cast_to_LineOffsetCache__
                      ((WriteBarrierPtr *)&this->m_lineOffsetCache);
  if (*ppLVar1 == (LineOffsetCache *)0x0) {
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (&local_18,
               ExceptionType_JavascriptException|ExceptionType_StackOverflow|
               ExceptionType_OutOfMemory);
    EnsureLineOffsetCache(this);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_18);
  }
  return local_14;
}

Assistant:

HRESULT Utf8SourceInfo::EnsureLineOffsetCacheNoThrow()
    {
        HRESULT hr = S_OK;
        // This is a double check, otherwise we would have to have a private function, and add an assert.
        // Basically the outer check is for try/catch, inner check (inside EnsureLineOffsetCache) is for that method as its public.
        if (this->m_lineOffsetCache == nullptr)
        {
            BEGIN_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED
            {
                this->EnsureLineOffsetCache();
            }
            END_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NOASSERT(hr);
        }